

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# min_max_operations.c
# Opt level: O3

size_t WebRtcSpl_MinIndexW16(int16_t *vector,size_t length)

{
  size_t sVar1;
  short sVar2;
  size_t sVar3;
  
  if (length == 0) {
    __assert_fail("length > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/signal_processing/min_max_operations.c"
                  ,0xc5,"size_t WebRtcSpl_MinIndexW16(const int16_t *, size_t)");
  }
  sVar2 = 0x7fff;
  sVar1 = 0;
  sVar3 = 0;
  do {
    if (vector[sVar3] < sVar2) {
      sVar2 = vector[sVar3];
      sVar1 = sVar3;
    }
    sVar3 = sVar3 + 1;
  } while (length != sVar3);
  return sVar1;
}

Assistant:

size_t WebRtcSpl_MinIndexW16(const int16_t* vector, size_t length) {
  size_t i = 0, index = 0;
  int16_t minimum = WEBRTC_SPL_WORD16_MAX;

  assert(length > 0);

  for (i = 0; i < length; i++) {
    if (vector[i] < minimum) {
      minimum = vector[i];
      index = i;
    }
  }

  return index;
}